

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::optimizePowerOf2URem<unsigned_int>
          (OptimizeInstructions *this,Binary *binary,uint c)

{
  Const *pCVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 local_30;
  undefined8 local_20;
  
  binary->op = AndInt32;
  local_30.i32 = c - 1;
  local_20 = 2;
  pCVar1 = Expression::cast<wasm::Const>(binary->right);
  Literal::operator=(&pCVar1->value,(Literal *)&local_30.func);
  Literal::~Literal((Literal *)&local_30.func);
  return (Expression *)binary;
}

Assistant:

Expression* optimizePowerOf2URem(Binary* binary, T c) {
    static_assert(std::is_same<T, uint32_t>::value ||
                    std::is_same<T, uint64_t>::value,
                  "type mismatch");
    binary->op = std::is_same<T, uint32_t>::value ? AndInt32 : AndInt64;
    binary->right->cast<Const>()->value = Literal(c - 1);
    return binary;
  }